

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O0

ApiType glu::getMinAPIForGLSLVersion(GLSLVersion version)

{
  int iVar1;
  ApiType *pAVar2;
  GLSLVersion version_local;
  
  if (getMinAPIForGLSLVersion(glu::GLSLVersion)::s_minApi == '\0') {
    iVar1 = __cxa_guard_acquire(&getMinAPIForGLSLVersion(glu::GLSLVersion)::s_minApi);
    if (iVar1 != 0) {
      getMinAPIForGLSLVersion::s_minApi[0] = ApiType::es(2,0);
      getMinAPIForGLSLVersion::s_minApi[1] = ApiType::es(3,0);
      getMinAPIForGLSLVersion::s_minApi[2] = ApiType::es(3,1);
      getMinAPIForGLSLVersion::s_minApi[3] = ApiType::es(3,2);
      getMinAPIForGLSLVersion::s_minApi[4] = ApiType::core(3,0);
      getMinAPIForGLSLVersion::s_minApi[5] = ApiType::core(3,1);
      getMinAPIForGLSLVersion::s_minApi[6] = ApiType::core(3,2);
      getMinAPIForGLSLVersion::s_minApi[7] = ApiType::core(3,3);
      getMinAPIForGLSLVersion::s_minApi[8] = ApiType::core(4,0);
      getMinAPIForGLSLVersion::s_minApi[9] = ApiType::core(4,1);
      getMinAPIForGLSLVersion::s_minApi[10] = ApiType::core(4,2);
      getMinAPIForGLSLVersion::s_minApi[0xb] = ApiType::core(4,3);
      getMinAPIForGLSLVersion::s_minApi[0xc] = ApiType::core(4,4);
      getMinAPIForGLSLVersion::s_minApi[0xd] = ApiType::core(4,5);
      __cxa_guard_release(&getMinAPIForGLSLVersion(glu::GLSLVersion)::s_minApi);
    }
  }
  pAVar2 = de::getSizedArrayElement<14,14,glu::ApiType>(&getMinAPIForGLSLVersion::s_minApi,version);
  return (ApiType)pAVar2->m_bits;
}

Assistant:

static ApiType getMinAPIForGLSLVersion (GLSLVersion version)
{
	static const ApiType s_minApi[] =
	{
		ApiType::es(2,0),
		ApiType::es(3,0),
		ApiType::es(3,1),
		ApiType::es(3,2),
		ApiType::core(3,0),
		ApiType::core(3,1),
		ApiType::core(3,2),
		ApiType::core(3,3),
		ApiType::core(4,0),
		ApiType::core(4,1),
		ApiType::core(4,2),
		ApiType::core(4,3),
		ApiType::core(4,4),
		ApiType::core(4,5),
	};

	return de::getSizedArrayElement<GLSL_VERSION_LAST>(s_minApi, version);
}